

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes_x86.c
# Opt level: O2

void aes_init_dec_x86(aes_context *ctx,uint8_t *key)

{
  undefined8 uVar1;
  ulong uVar2;
  uint32_t *puVar3;
  aes_context *paVar4;
  ulong uVar5;
  long lVar6;
  undefined1 auVar7 [16];
  aes_context enc;
  
  enc.nr = ctx->nr;
  lVar6 = (long)enc.nr;
  aes_init_x86(&enc,key);
  *(undefined8 *)(ctx->key + lVar6 * 4) = enc.key._0_8_;
  *(undefined8 *)(ctx->key + lVar6 * 4 + 2) = enc.key._8_8_;
  puVar3 = enc.key;
  paVar4 = ctx;
  for (uVar2 = 1; puVar3 = puVar3 + 4, uVar5 = (ulong)ctx->nr, uVar2 < uVar5; uVar2 = uVar2 + 1) {
    auVar7 = aesimc(*(undefined1 (*) [16])puVar3);
    *(undefined1 (*) [16])(paVar4->key + uVar5 * 4 + -4) = auVar7;
    paVar4 = (aes_context *)(paVar4[-1].key + 0x40);
  }
  uVar1 = *(undefined8 *)(enc.key + uVar5 * 4 + 2);
  *(undefined8 *)ctx->key = *(undefined8 *)(enc.key + uVar5 * 4);
  *(undefined8 *)(ctx->key + 2) = uVar1;
  return;
}

Assistant:

void aes_init_dec_x86(aes_context* ctx, const uint8_t* key)
{
  aes_context enc;
  enc.nr = ctx->nr;
  aes_init_x86(&enc, key);

  const __m128i* ekey = (__m128i*)&enc.key;
  __m128i* dkey = (__m128i*)&ctx->key;

  _mm_store_si128(dkey + ctx->nr, _mm_load_si128(ekey + 0));
  for (size_t i = 1; i < ctx->nr; i++)
  {
    _mm_store_si128(dkey + ctx->nr - i, _mm_aesimc_si128(_mm_load_si128(ekey + i)));
  }
  _mm_store_si128(dkey + 0, _mm_load_si128(ekey + ctx->nr));
}